

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O1

BVHNodeRecord<embree::NodeRefPtr<8>_> * __thiscall
embree::avx::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create,_embree::avx::SetBVHNBounds<8>,_embree::avx::CreateMortonLeaf<8,_embree::InstanceArrayPrimitive>,_embree::avx::CalculateMeshBounds<embree::InstanceArray>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(BVHNodeRecord<embree::NodeRefPtr<8>_> *__return_storage_ptr__,
                 BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create,_embree::avx::SetBVHNBounds<8>,_embree::avx::CreateMortonLeaf<8,_embree::InstanceArrayPrimitive>,_embree::avx::CalculateMeshBounds<embree::InstanceArray>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,size_t depth,range<unsigned_int> *current,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined4 uVar6;
  ThreadLocal2 *this_00;
  iterator __position;
  CachedAllocator alloc_00;
  FastAllocator *this_01;
  ThreadLocal *pTVar7;
  long lVar8;
  undefined1 (*pauVar9) [16];
  size_t sVar10;
  undefined8 *puVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  ulong uVar15;
  ulong uVar16;
  range<unsigned_int> rVar17;
  uint uVar18;
  ulong uVar19;
  range<unsigned_int> rVar20;
  ulong uVar21;
  ulong uVar22;
  range<unsigned_int> *current_00;
  ulong uVar23;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar24;
  undefined1 auVar25 [32];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar26;
  range<unsigned_int> children [8];
  BVHNodeRecord<embree::NodeRefPtr<4>_> bounds [8];
  MutexSys *local_248;
  size_t local_240;
  ThreadLocal2 *local_238;
  BVHNodeRecord<embree::NodeRefPtr<8>_> *local_230;
  BVHNodeRecord<embree::NodeRefPtr<8>_> local_228;
  range<unsigned_int> local_1f8 [8];
  MutexSys *local_1b8;
  char local_1b0;
  undefined7 uStack_1af;
  MutexSys local_1a8 [2];
  undefined8 local_198 [45];
  
  this_01 = alloc.alloc;
  pTVar7 = alloc.talloc0;
  if ((this->super_Settings).maxDepth < depth) {
    puVar11 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"depth limit reached","");
    *puVar11 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar11 + 1) = 1;
    puVar11[2] = puVar11 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar11 + 2),local_1b8,
               (long)&local_1b8->mutex + CONCAT71(uStack_1af,local_1b0));
    __cxa_throw(puVar11,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  uVar22 = (this->super_Settings).maxLeafSize;
  if (uVar22 < current->_end - current->_begin) {
    local_1f8[0] = *current;
    uVar13 = (this->super_Settings).branchingFactor;
    uVar23 = 1;
    do {
      if (uVar23 == 0) {
        uVar12 = 0xffffffffffffffff;
      }
      else {
        uVar15 = 0;
        uVar19 = 0;
        uVar16 = 0xffffffffffffffff;
        do {
          uVar21 = (ulong)(local_1f8[uVar15]._end - local_1f8[uVar15]._begin);
          uVar12 = uVar15;
          if (uVar21 <= uVar22 || uVar21 <= uVar19) {
            uVar12 = uVar16;
            uVar21 = uVar19;
          }
          uVar19 = uVar21;
          uVar15 = uVar15 + 1;
          uVar16 = uVar12;
        } while (uVar23 != uVar15);
      }
      if (uVar12 == 0xffffffffffffffff) break;
      uVar18 = local_1f8[uVar12]._end + local_1f8[uVar12]._begin >> 1;
      rVar17._end = local_1f8[uVar12]._end;
      rVar17._begin = uVar18;
      rVar20._end = uVar18;
      rVar20._begin = local_1f8[uVar12]._begin;
      local_1f8[uVar12] = local_1f8[uVar23 - 1];
      local_1f8[uVar23 - 1] = rVar20;
      local_1f8[uVar23] = rVar17;
      uVar23 = uVar23 + 1;
    } while (uVar23 < uVar13);
    local_248 = (MutexSys *)0x100;
    this_00 = (alloc.talloc0)->parent;
    local_240 = depth;
    if (alloc.alloc != (this_00->alloc)._M_b._M_p) {
      local_228._8_1_ = '\x01';
      local_228.ref.ptr = (size_t)this_00;
      MutexSys::lock(&this_00->mutex);
      if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((this_00->alloc0).end + (this_00->alloc1).end) -
             ((this_00->alloc0).cur + (this_00->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar25 = ZEXT1632(ZEXT816(0) << 0x40);
      (this_00->alloc0).end = auVar25._0_8_;
      (this_00->alloc0).allocBlockSize = auVar25._8_8_;
      (this_00->alloc0).bytesUsed = auVar25._16_8_;
      (this_00->alloc0).bytesWasted = auVar25._24_8_;
      (this_00->alloc0).ptr = (char *)auVar25._0_8_;
      (this_00->alloc0).cur = auVar25._8_8_;
      (this_00->alloc0).end = auVar25._16_8_;
      (this_00->alloc0).allocBlockSize = auVar25._24_8_;
      auVar25 = ZEXT1632(ZEXT816(0) << 0x40);
      if (this_01 == (FastAllocator *)0x0) {
        (this_00->alloc1).end = auVar25._0_8_;
        (this_00->alloc1).allocBlockSize = auVar25._8_8_;
        (this_00->alloc1).bytesUsed = auVar25._16_8_;
        (this_00->alloc1).bytesWasted = auVar25._24_8_;
        (this_00->alloc1).ptr = (char *)auVar25._0_8_;
        (this_00->alloc1).cur = auVar25._8_8_;
        (this_00->alloc1).end = auVar25._16_8_;
        (this_00->alloc1).allocBlockSize = auVar25._24_8_;
      }
      else {
        (this_00->alloc0).allocBlockSize = this_01->defaultBlockSize;
        (this_00->alloc1).ptr = (char *)auVar25._0_8_;
        (this_00->alloc1).cur = auVar25._8_8_;
        (this_00->alloc1).end = auVar25._16_8_;
        (this_00->alloc1).allocBlockSize = auVar25._24_8_;
        (this_00->alloc1).end = auVar25._0_8_;
        (this_00->alloc1).allocBlockSize = auVar25._8_8_;
        (this_00->alloc1).bytesUsed = auVar25._16_8_;
        (this_00->alloc1).bytesWasted = auVar25._24_8_;
        (this_00->alloc1).allocBlockSize = this_01->defaultBlockSize;
      }
      LOCK();
      (this_00->alloc)._M_b._M_p = this_01;
      UNLOCK();
      local_1b8 = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
      local_1b0 = '\x01';
      local_238 = this_00;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      __position._M_current =
           (this_01->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this_01->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&this_01->thread_local_allocators,__position,&local_238);
      }
      else {
        *__position._M_current = local_238;
        pppTVar2 = &(this_01->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      if (local_1b0 == '\x01') {
        MutexSys::unlock(local_1b8);
      }
      if (local_228._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)local_228.ref.ptr);
      }
    }
    pTVar7->bytesUsed = (long)&local_248->mutex + pTVar7->bytesUsed;
    sVar10 = pTVar7->cur;
    uVar22 = (ulong)(-(int)sVar10 & 0x1f);
    uVar13 = (long)&local_248->mutex + uVar22 + sVar10;
    pTVar7->cur = uVar13;
    if (pTVar7->end < uVar13) {
      pTVar7->cur = sVar10;
      if ((MutexSys *)pTVar7->allocBlockSize < (MutexSys *)((long)local_248 << 2)) {
        pcVar14 = (char *)FastAllocator::malloc(this_01,(size_t)&local_248);
      }
      else {
        local_1b8 = (MutexSys *)pTVar7->allocBlockSize;
        pcVar14 = (char *)FastAllocator::malloc(this_01,(size_t)&local_1b8);
        pTVar7->ptr = pcVar14;
        sVar10 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
        pTVar7->bytesWasted = sVar10;
        pTVar7->cur = 0;
        pTVar7->end = (size_t)local_1b8;
        pTVar7->cur = (size_t)local_248;
        if (local_1b8 < local_248) {
          pTVar7->cur = 0;
          local_1b8 = (MutexSys *)pTVar7->allocBlockSize;
          pcVar14 = (char *)FastAllocator::malloc(this_01,(size_t)&local_1b8);
          pTVar7->ptr = pcVar14;
          sVar10 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
          pTVar7->bytesWasted = sVar10;
          pTVar7->cur = 0;
          pTVar7->end = (size_t)local_1b8;
          pTVar7->cur = (size_t)local_248;
          if (local_1b8 < local_248) {
            pTVar7->cur = 0;
            pcVar14 = (char *)0x0;
          }
          else {
            pTVar7->bytesWasted = sVar10;
          }
        }
        else {
          pTVar7->bytesWasted = sVar10;
        }
      }
    }
    else {
      pTVar7->bytesWasted = pTVar7->bytesWasted + uVar22;
      pcVar14 = pTVar7->ptr + (uVar13 - (long)local_248);
    }
    pcVar14[0xc0] = '\0';
    pcVar14[0xc1] = '\0';
    pcVar14[0xc2] = -0x80;
    pcVar14[0xc3] = '\x7f';
    pcVar14[0xc4] = '\0';
    pcVar14[0xc5] = '\0';
    pcVar14[0xc6] = -0x80;
    pcVar14[199] = '\x7f';
    pcVar14[200] = '\0';
    pcVar14[0xc9] = '\0';
    pcVar14[0xca] = -0x80;
    pcVar14[0xcb] = '\x7f';
    pcVar14[0xcc] = '\0';
    pcVar14[0xcd] = '\0';
    pcVar14[0xce] = -0x80;
    pcVar14[0xcf] = '\x7f';
    pcVar14[0xd0] = '\0';
    pcVar14[0xd1] = '\0';
    pcVar14[0xd2] = -0x80;
    pcVar14[0xd3] = '\x7f';
    pcVar14[0xd4] = '\0';
    pcVar14[0xd5] = '\0';
    pcVar14[0xd6] = -0x80;
    pcVar14[0xd7] = '\x7f';
    pcVar14[0xd8] = '\0';
    pcVar14[0xd9] = '\0';
    pcVar14[0xda] = -0x80;
    pcVar14[0xdb] = '\x7f';
    pcVar14[0xdc] = '\0';
    pcVar14[0xdd] = '\0';
    pcVar14[0xde] = -0x80;
    pcVar14[0xdf] = '\x7f';
    pcVar14[0x80] = '\0';
    pcVar14[0x81] = '\0';
    pcVar14[0x82] = -0x80;
    pcVar14[0x83] = '\x7f';
    pcVar14[0x84] = '\0';
    pcVar14[0x85] = '\0';
    pcVar14[0x86] = -0x80;
    pcVar14[0x87] = '\x7f';
    pcVar14[0x88] = '\0';
    pcVar14[0x89] = '\0';
    pcVar14[0x8a] = -0x80;
    pcVar14[0x8b] = '\x7f';
    pcVar14[0x8c] = '\0';
    pcVar14[0x8d] = '\0';
    pcVar14[0x8e] = -0x80;
    pcVar14[0x8f] = '\x7f';
    pcVar14[0x90] = '\0';
    pcVar14[0x91] = '\0';
    pcVar14[0x92] = -0x80;
    pcVar14[0x93] = '\x7f';
    pcVar14[0x94] = '\0';
    pcVar14[0x95] = '\0';
    pcVar14[0x96] = -0x80;
    pcVar14[0x97] = '\x7f';
    pcVar14[0x98] = '\0';
    pcVar14[0x99] = '\0';
    pcVar14[0x9a] = -0x80;
    pcVar14[0x9b] = '\x7f';
    pcVar14[0x9c] = '\0';
    pcVar14[0x9d] = '\0';
    pcVar14[0x9e] = -0x80;
    pcVar14[0x9f] = '\x7f';
    pcVar14[0x40] = '\0';
    pcVar14[0x41] = '\0';
    pcVar14[0x42] = -0x80;
    pcVar14[0x43] = '\x7f';
    pcVar14[0x44] = '\0';
    pcVar14[0x45] = '\0';
    pcVar14[0x46] = -0x80;
    pcVar14[0x47] = '\x7f';
    pcVar14[0x48] = '\0';
    pcVar14[0x49] = '\0';
    pcVar14[0x4a] = -0x80;
    pcVar14[0x4b] = '\x7f';
    pcVar14[0x4c] = '\0';
    pcVar14[0x4d] = '\0';
    pcVar14[0x4e] = -0x80;
    pcVar14[0x4f] = '\x7f';
    pcVar14[0x50] = '\0';
    pcVar14[0x51] = '\0';
    pcVar14[0x52] = -0x80;
    pcVar14[0x53] = '\x7f';
    pcVar14[0x54] = '\0';
    pcVar14[0x55] = '\0';
    pcVar14[0x56] = -0x80;
    pcVar14[0x57] = '\x7f';
    pcVar14[0x58] = '\0';
    pcVar14[0x59] = '\0';
    pcVar14[0x5a] = -0x80;
    pcVar14[0x5b] = '\x7f';
    pcVar14[0x5c] = '\0';
    pcVar14[0x5d] = '\0';
    pcVar14[0x5e] = -0x80;
    pcVar14[0x5f] = '\x7f';
    pcVar14[0xe0] = '\0';
    pcVar14[0xe1] = '\0';
    pcVar14[0xe2] = -0x80;
    pcVar14[0xe3] = -1;
    pcVar14[0xe4] = '\0';
    pcVar14[0xe5] = '\0';
    pcVar14[0xe6] = -0x80;
    pcVar14[0xe7] = -1;
    pcVar14[0xe8] = '\0';
    pcVar14[0xe9] = '\0';
    pcVar14[0xea] = -0x80;
    pcVar14[0xeb] = -1;
    pcVar14[0xec] = '\0';
    pcVar14[0xed] = '\0';
    pcVar14[0xee] = -0x80;
    pcVar14[0xef] = -1;
    pcVar14[0xf0] = '\0';
    pcVar14[0xf1] = '\0';
    pcVar14[0xf2] = -0x80;
    pcVar14[0xf3] = -1;
    pcVar14[0xf4] = '\0';
    pcVar14[0xf5] = '\0';
    pcVar14[0xf6] = -0x80;
    pcVar14[0xf7] = -1;
    pcVar14[0xf8] = '\0';
    pcVar14[0xf9] = '\0';
    pcVar14[0xfa] = -0x80;
    pcVar14[0xfb] = -1;
    pcVar14[0xfc] = '\0';
    pcVar14[0xfd] = '\0';
    pcVar14[0xfe] = -0x80;
    pcVar14[0xff] = -1;
    pcVar14[0xa0] = '\0';
    pcVar14[0xa1] = '\0';
    pcVar14[0xa2] = -0x80;
    pcVar14[0xa3] = -1;
    pcVar14[0xa4] = '\0';
    pcVar14[0xa5] = '\0';
    pcVar14[0xa6] = -0x80;
    pcVar14[0xa7] = -1;
    pcVar14[0xa8] = '\0';
    pcVar14[0xa9] = '\0';
    pcVar14[0xaa] = -0x80;
    pcVar14[0xab] = -1;
    pcVar14[0xac] = '\0';
    pcVar14[0xad] = '\0';
    pcVar14[0xae] = -0x80;
    pcVar14[0xaf] = -1;
    pcVar14[0xb0] = '\0';
    pcVar14[0xb1] = '\0';
    pcVar14[0xb2] = -0x80;
    pcVar14[0xb3] = -1;
    pcVar14[0xb4] = '\0';
    pcVar14[0xb5] = '\0';
    pcVar14[0xb6] = -0x80;
    pcVar14[0xb7] = -1;
    pcVar14[0xb8] = '\0';
    pcVar14[0xb9] = '\0';
    pcVar14[0xba] = -0x80;
    pcVar14[0xbb] = -1;
    pcVar14[0xbc] = '\0';
    pcVar14[0xbd] = '\0';
    pcVar14[0xbe] = -0x80;
    pcVar14[0xbf] = -1;
    pcVar14[0x60] = '\0';
    pcVar14[0x61] = '\0';
    pcVar14[0x62] = -0x80;
    pcVar14[99] = -1;
    pcVar14[100] = '\0';
    pcVar14[0x65] = '\0';
    pcVar14[0x66] = -0x80;
    pcVar14[0x67] = -1;
    pcVar14[0x68] = '\0';
    pcVar14[0x69] = '\0';
    pcVar14[0x6a] = -0x80;
    pcVar14[0x6b] = -1;
    pcVar14[0x6c] = '\0';
    pcVar14[0x6d] = '\0';
    pcVar14[0x6e] = -0x80;
    pcVar14[0x6f] = -1;
    pcVar14[0x70] = '\0';
    pcVar14[0x71] = '\0';
    pcVar14[0x72] = -0x80;
    pcVar14[0x73] = -1;
    pcVar14[0x74] = '\0';
    pcVar14[0x75] = '\0';
    pcVar14[0x76] = -0x80;
    pcVar14[0x77] = -1;
    pcVar14[0x78] = '\0';
    pcVar14[0x79] = '\0';
    pcVar14[0x7a] = -0x80;
    pcVar14[0x7b] = -1;
    pcVar14[0x7c] = '\0';
    pcVar14[0x7d] = '\0';
    pcVar14[0x7e] = -0x80;
    pcVar14[0x7f] = -1;
    lVar8 = 0;
    do {
      pcVar3 = pcVar14 + lVar8 * 8;
      pcVar3[0] = '\b';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
      pcVar3[8] = '\b';
      pcVar3[9] = '\0';
      pcVar3[10] = '\0';
      pcVar3[0xb] = '\0';
      pcVar3[0xc] = '\0';
      pcVar3[0xd] = '\0';
      pcVar3[0xe] = '\0';
      pcVar3[0xf] = '\0';
      pcVar3[0x10] = '\b';
      pcVar3[0x11] = '\0';
      pcVar3[0x12] = '\0';
      pcVar3[0x13] = '\0';
      pcVar3[0x14] = '\0';
      pcVar3[0x15] = '\0';
      pcVar3[0x16] = '\0';
      pcVar3[0x17] = '\0';
      pcVar3[0x18] = '\b';
      pcVar3[0x19] = '\0';
      pcVar3[0x1a] = '\0';
      pcVar3[0x1b] = '\0';
      pcVar3[0x1c] = '\0';
      pcVar3[0x1d] = '\0';
      pcVar3[0x1e] = '\0';
      pcVar3[0x1f] = '\0';
      lVar8 = lVar8 + 4;
    } while (lVar8 != 8);
    if (uVar23 == 0) {
      aVar24.m128[2] = -INFINITY;
      aVar24._0_8_ = 0xff800000ff800000;
      aVar24.m128[3] = -INFINITY;
      aVar26.m128[2] = INFINITY;
      aVar26._0_8_ = 0x7f8000007f800000;
      aVar26.m128[3] = INFINITY;
    }
    else {
      local_240 = local_240 + 1;
      current_00 = local_1f8;
      puVar11 = local_198;
      uVar22 = uVar23;
      local_230 = __return_storage_ptr__;
      do {
        alloc_00.talloc0 = alloc.talloc0;
        alloc_00.alloc = alloc.alloc;
        alloc_00.talloc1 = alloc.talloc1;
        createLargeLeaf(&local_228,this,local_240,current_00,alloc_00);
        puVar11[-4] = local_228.ref.ptr;
        puVar11[-2] = local_228.bounds.lower.field_0._0_8_;
        puVar11[-1] = local_228.bounds.lower.field_0._8_8_;
        *puVar11 = local_228.bounds.upper.field_0._0_8_;
        puVar11[1] = local_228.bounds.upper.field_0._8_8_;
        puVar11 = puVar11 + 6;
        current_00 = current_00 + 1;
        uVar22 = uVar22 - 1;
      } while (uVar22 != 0);
      aVar26.m128[2] = INFINITY;
      aVar26._0_8_ = 0x7f8000007f800000;
      aVar26.m128[3] = INFINITY;
      aVar24.m128[2] = -INFINITY;
      aVar24._0_8_ = 0xff800000ff800000;
      aVar24.m128[3] = -INFINITY;
      pauVar9 = (undefined1 (*) [16])local_198;
      uVar22 = 0;
      do {
        auVar4 = pauVar9[-1];
        auVar5 = *pauVar9;
        *(undefined8 *)(pcVar14 + uVar22 * 8) = *(undefined8 *)pauVar9[-2];
        *(int *)(pcVar14 + uVar22 * 4 + 0x40) = auVar4._0_4_;
        uVar6 = vextractps_avx(auVar4,1);
        *(undefined4 *)(pcVar14 + uVar22 * 4 + 0x80) = uVar6;
        uVar6 = vextractps_avx(auVar4,2);
        *(undefined4 *)(pcVar14 + uVar22 * 4 + 0xc0) = uVar6;
        *(int *)(pcVar14 + uVar22 * 4 + 0x60) = auVar5._0_4_;
        uVar6 = vextractps_avx(auVar5,1);
        *(undefined4 *)(pcVar14 + uVar22 * 4 + 0xa0) = uVar6;
        aVar26.m128 = (__m128)vminps_avx(aVar26.m128,auVar4);
        uVar6 = vextractps_avx(auVar5,2);
        *(undefined4 *)(pcVar14 + uVar22 * 4 + 0xe0) = uVar6;
        aVar24.m128 = (__m128)vmaxps_avx(aVar24.m128,auVar5);
        uVar22 = uVar22 + 1;
        pauVar9 = pauVar9 + 3;
        __return_storage_ptr__ = local_230;
      } while (uVar23 != uVar22);
    }
    (__return_storage_ptr__->ref).ptr = (size_t)pcVar14;
    (__return_storage_ptr__->bounds).lower.field_0 = aVar26;
    (__return_storage_ptr__->bounds).upper.field_0 = aVar24;
  }
  else {
    CreateMortonLeaf<8,_embree::InstanceArrayPrimitive>::operator()
              (__return_storage_ptr__,this->createLeaf,current,&alloc);
  }
  return __return_storage_ptr__;
}

Assistant:

ReductionTy createLargeLeaf(size_t depth, const range<unsigned>& current, Allocator alloc)
        {
          /* this should never occur but is a fatal error */
          if (depth > maxDepth)
            throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

          /* create leaf for few primitives */
          if (current.size() <= maxLeafSize)
            return createLeaf(current,alloc);

          /* fill all children by always splitting the largest one */
          range<unsigned> children[MAX_BRANCHING_FACTOR];
          size_t numChildren = 1;
          children[0] = current;

          do {

            /* find best child with largest number of primitives */
            size_t bestChild = -1;
            size_t bestSize = 0;
            for (size_t i=0; i<numChildren; i++)
            {
              /* ignore leaves as they cannot get split */
              if (children[i].size() <= maxLeafSize)
                continue;

              /* remember child with largest size */
              if (children[i].size() > bestSize) {
                bestSize = children[i].size();
                bestChild = i;
              }
            }
            if (bestChild == size_t(-1)) break;

            /*! split best child into left and right child */
            auto split = children[bestChild].split();

            /* add new children left and right */
            children[bestChild] = children[numChildren-1];
            children[numChildren-1] = split.first;
            children[numChildren+0] = split.second;
            numChildren++;

          } while (numChildren < branchingFactor);

          /* create node */
          auto node = createNode(alloc,numChildren);

          /* recurse into each child */
          ReductionTy bounds[MAX_BRANCHING_FACTOR];
          for (size_t i=0; i<numChildren; i++)
            bounds[i] = createLargeLeaf(depth+1,children[i],alloc);

          return setBounds(node,bounds,numChildren);
        }